

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD2LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  DecodeStatus DVar7;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint Rm;
  uint Rn;
  uint inc;
  uint index;
  uint align;
  uint size;
  DecodeStatus S;
  uint numBits;
  uint RegNo;
  uint uVar8;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_2c[0] = MCDisassembler_Success;
  uVar8 = 0;
  RegNo = 1;
  numBits = 4;
  local_14 = in_ESI;
  local_10 = in_RDI;
  fieldFromInstruction_4(in_ESI,0x10,4);
  uVar2 = fieldFromInstruction_4(local_14,0,numBits);
  uVar3 = fieldFromInstruction_4(local_14,0xc,numBits);
  uVar4 = fieldFromInstruction_4(local_14,0x16,1);
  uVar5 = uVar3 | uVar4 << 4;
  uVar3 = fieldFromInstruction_4(local_14,10,2);
  if (uVar3 == 0) {
    uVar4 = fieldFromInstruction_4(local_14,5,3);
    uVar6 = fieldFromInstruction_4(local_14,4,1);
    if (uVar6 != 0) {
      uVar8 = 2;
    }
  }
  else if (uVar3 == 1) {
    uVar4 = fieldFromInstruction_4(local_14,6,2);
    uVar6 = fieldFromInstruction_4(local_14,4,1);
    if (uVar6 != 0) {
      uVar8 = 4;
    }
    uVar6 = fieldFromInstruction_4(local_14,5,1);
    if (uVar6 != 0) {
      RegNo = 2;
    }
  }
  else {
    if (uVar3 != 2) {
      return MCDisassembler_Fail;
    }
    uVar4 = fieldFromInstruction_4(local_14,5,1);
    if (uVar4 != 0) {
      return MCDisassembler_Fail;
    }
    uVar4 = fieldFromInstruction_4(local_14,7,1);
    uVar6 = fieldFromInstruction_4(local_14,4,1);
    if (uVar6 != 0) {
      uVar8 = 8;
    }
    uVar6 = fieldFromInstruction_4(local_14,6,1);
    if (uVar6 != 0) {
      RegNo = 2;
    }
  }
  DVar7 = DecodeDPRRegisterClass
                    ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                     (void *)CONCAT44(uVar3,numBits));
  _Var1 = Check(local_2c,DVar7);
  if (_Var1) {
    DVar7 = DecodeDPRRegisterClass
                      ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                       (void *)CONCAT44(uVar3,numBits));
    _Var1 = Check(local_2c,DVar7);
    if (_Var1) {
      if (uVar2 != 0xf) {
        DVar7 = DecodeGPRRegisterClass
                          ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                           (void *)CONCAT44(uVar3,numBits));
        _Var1 = Check(local_2c,DVar7);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
      DVar7 = DecodeGPRRegisterClass
                        ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                         (void *)CONCAT44(uVar3,numBits));
      _Var1 = Check(local_2c,DVar7);
      if (_Var1) {
        MCOperand_CreateImm0(local_10,(ulong)uVar8);
        if (uVar2 != 0xf) {
          if (uVar2 == 0xd) {
            MCOperand_CreateReg0(local_10,0);
          }
          else {
            DVar7 = DecodeGPRRegisterClass
                              ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                               (void *)CONCAT44(uVar3,numBits));
            _Var1 = Check(local_2c,DVar7);
            if (!_Var1) {
              return MCDisassembler_Fail;
            }
          }
        }
        DVar7 = DecodeDPRRegisterClass
                          ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                           (void *)CONCAT44(uVar3,numBits));
        _Var1 = Check(local_2c,DVar7);
        if (_Var1) {
          DVar7 = DecodeDPRRegisterClass
                            ((MCInst *)CONCAT44(uVar8,uVar4),RegNo,CONCAT44(uVar2,uVar5),
                             (void *)CONCAT44(uVar3,numBits));
          _Var1 = Check(local_2c,DVar7);
          if (_Var1) {
            MCOperand_CreateImm0(local_10,(ulong)uVar4);
            local_4 = local_2c[0];
          }
          else {
            local_4 = MCDisassembler_Fail;
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLD2LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			index = fieldFromInstruction_4(Insn, 5, 3);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 1:
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 4, 1) != 0)
				align = 8;
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}